

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O2

void __thiscall Alice::BlindPermuteData(Alice *this)

{
  uint uVar1;
  pointer pvVar2;
  pointer pvVar3;
  long lVar4;
  long lVar5;
  Server *this_00;
  ulong uVar6;
  undefined1 auVar7 [8];
  ulong uVar8;
  int j;
  long lVar9;
  _Vector_base<DataElement,_std::allocator<DataElement>_> local_60;
  _Vector_base<DataElement,_std::allocator<DataElement>_> local_48;
  undefined1 local_30 [8];
  vector<DataElement,_std::allocator<DataElement>_> V;
  
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            ((vector<DataElement,_std::allocator<DataElement>_> *)local_30,
             (long)(this->super_Party).n_d,(allocator_type *)&local_48);
  uVar1 = (this->super_Party).n_d;
  pvVar2 = (this->super_Party).D.
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (this->super_Party).R_D.
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = 0;
  uVar6 = (ulong)uVar1;
  auVar7 = local_30;
  if ((int)uVar1 < 1) {
    uVar6 = uVar8;
  }
  for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
    lVar4 = *(long *)&pvVar2[uVar8].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data;
    lVar5 = *(long *)&pvVar3[uVar8].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data;
    for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
      ((pointer)auVar7)->val[lVar9] = *(long *)(lVar5 + lVar9 * 8) + *(long *)(lVar4 + lVar9 * 8);
    }
    auVar7 = (undefined1  [8])((long)auVar7 + 0x10);
  }
  this_00 = this->srv;
  std::vector<DataElement,_std::allocator<DataElement>_>::vector
            ((vector<DataElement,_std::allocator<DataElement>_> *)&local_60,
             (vector<DataElement,_std::allocator<DataElement>_> *)local_30);
  Server::SendDataVector
            (this_00,(vector<DataElement,_std::allocator<DataElement>_> *)&local_60,
             (this->super_Party).n_d);
  std::_Vector_base<DataElement,_std::allocator<DataElement>_>::~_Vector_base(&local_60);
  Server::ReceiveDataVector
            ((vector<DataElement,_std::allocator<DataElement>_> *)&local_48,this->srv);
  std::vector<DataElement,_std::allocator<DataElement>_>::operator=
            ((vector<DataElement,_std::allocator<DataElement>_> *)local_30,
             (vector<DataElement,_std::allocator<DataElement>_> *)&local_48);
  std::_Vector_base<DataElement,_std::allocator<DataElement>_>::~_Vector_base(&local_48);
  uVar1 = (this->super_Party).n_d;
  pvVar2 = (this->Pi_D_diff_R_DB_R_DA).
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (this->super_Party).D.
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = 0;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = uVar8;
  }
  for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
    lVar4 = *(long *)&pvVar2[uVar8].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data;
    lVar5 = *(long *)&pvVar3[uVar8].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data;
    for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
      *(long *)(lVar5 + lVar9 * 8) = *(long *)(lVar4 + lVar9 * 8) + ((pointer)local_30)->val[lVar9];
    }
    local_30 = (undefined1  [8])((long)local_30 + 0x10);
  }
  std::_Vector_base<DataElement,_std::allocator<DataElement>_>::~_Vector_base
            ((_Vector_base<DataElement,_std::allocator<DataElement>_> *)local_30);
  return;
}

Assistant:

void Alice::BlindPermuteData()
{
    std::vector<DataElement> V(n_d);
    for(int i=0; i<n_d; i++)
        for(int j=0; j<2; j++)
            V[i].val[j] = D[i][j] + R_D[i][j]; //masking Alice's data share
    srv->SendDataVector(V, n_d);    //sending Alice's masked data share to Bob for BlindPermutation
    V = srv->ReceiveDataVector();   //receiving Alice's BlindPermuted share of D
    for(int i=0; i<n_d; i++)
        for(int j=0; j<2; j++)
            D[i][j] = V[i].val[j] + Pi_D_diff_R_DB_R_DA[i][j]; //Adjusting for the resplit
}